

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O2

vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
* testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::shrink
            (vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,output_type *t)

{
  _Fwd_list_node_base *p_Var1;
  difference_type dVar2;
  long lVar3;
  _Self __tmp;
  _Fwd_list_const_iterator<int> __first;
  bool bVar4;
  _Fwd_list_impl local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = (t->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next;
  if (p_Var1 != (_Fwd_list_node_base *)0x0) {
    dVar2 = ::std::__distance<std::_Fwd_list_const_iterator<int>>(p_Var1,0);
    __first._M_node = (t->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next;
    local_30._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    ::std::
    vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
    ::emplace_back<std::forward_list<int,std::allocator<int>>>
              ((vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
                *)__return_storage_ptr__,(forward_list<int,_std::allocator<int>_> *)&local_30);
    ::std::_Fwd_list_base<int,_std::allocator<int>_>::~_Fwd_list_base
              ((_Fwd_list_base<int,_std::allocator<int>_> *)&local_30);
    lVar3 = 0;
    if (0 < dVar2 / 2) {
      lVar3 = dVar2 / 2;
    }
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      ::std::forward_list<int,_std::allocator<int>_>::push_front
                ((__return_storage_ptr__->
                 super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,(int *)(__first._M_node + 1));
      __first._M_node = (__first._M_node)->_M_next;
    }
    if (1 < dVar2) {
      local_30._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
      ::std::
      vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
      ::emplace_back<std::forward_list<int,std::allocator<int>>>
                ((vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
                  *)__return_storage_ptr__,(forward_list<int,_std::allocator<int>_> *)&local_30);
      ::std::_Fwd_list_base<int,_std::allocator<int>_>::~_Fwd_list_base
                ((_Fwd_list_base<int,_std::allocator<int>_> *)&local_30);
      ::std::__copy_move<false,false,std::forward_iterator_tag>::
      __copy_m<std::_Fwd_list_const_iterator<int>,std::front_insert_iterator<std::forward_list<int,std::allocator<int>>>>
                (__first,(_Fwd_list_const_iterator<int>)0x0,
                 (__return_storage_ptr__->
                 super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<output_type> shrink(const output_type& t)
    {
      std::vector<output_type> v;
      if (t.empty()) return v;
      auto l = std::distance(t.cbegin(), t.cend()) / 2;
      auto it = t.cbegin();
      v.push_back(output_type());
      for (auto count = 0; count < l; count++, it++)
        v[0].push_front(*it);
      if (l > 0)
      {
        v.push_back(output_type());
        copy(it, t.cend(), std::front_inserter(v[1]));
      }
      return v;
    }